

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reqrep.c
# Opt level: O2

int main(void)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint *puVar6;
  char *pcVar7;
  char *in_RCX;
  int *piVar8;
  ulong uVar9;
  int in_EDX;
  int sock;
  int family;
  int sock_00;
  int family_00;
  int sock_01;
  int sock_02;
  int sock_03;
  int sock_04;
  int family_01;
  int sock_05;
  int family_02;
  int sock_06;
  int family_03;
  int sock_07;
  int sock_08;
  int sock_09;
  int sock_10;
  int family_04;
  int sock_11;
  int family_05;
  int sock_12;
  int sock_13;
  int sock_14;
  int family_06;
  int sock_15;
  int family_07;
  int sock_16;
  int sock_17;
  int sock_18;
  int family_08;
  int sock_19;
  int family_09;
  int sock_20;
  int family_10;
  int sock_21;
  int sock_22;
  int sock_23;
  int sock_24;
  int family_11;
  int sock_25;
  int family_12;
  int sock_26;
  int sock_27;
  int sock_28;
  FILE *__stream;
  undefined8 uStack_50;
  int timeo;
  int resend_ivl;
  char buf [7];
  
  iVar2 = test_socket_impl((char *)0x2a,0x31,in_EDX,(int)in_RCX);
  test_bind_impl((char *)0x2b,iVar2,sock,in_RCX);
  iVar3 = test_socket_impl((char *)0x2c,0x30,family,(int)in_RCX);
  test_connect_impl((char *)0x2d,iVar3,sock_00,in_RCX);
  iVar4 = test_socket_impl((char *)0x2e,0x30,family_00,(int)in_RCX);
  test_connect_impl((char *)0x2f,iVar4,sock_01,in_RCX);
  iVar5 = nn_send(iVar2,"ABC",3);
  if (iVar5 == -1) {
    iVar5 = nn_errno();
    if (iVar5 != 0x9523dfe) goto LAB_001017ea;
    pcVar7 = (char *)0x0;
    iVar5 = nn_recv(iVar3,buf,7);
    if (iVar5 == -1) {
      iVar5 = nn_errno();
      if (iVar5 == 0x9523dfe) {
        test_send_impl((char *)0x38,iVar4,0x102117,pcVar7);
        test_recv_impl((char *)0x39,iVar2,0x102117,pcVar7);
        test_send_impl((char *)0x3a,iVar2,0x102117,pcVar7);
        test_recv_impl((char *)0x3b,iVar4,0x102117,pcVar7);
        test_send_impl((char *)0x3d,iVar3,0x102117,pcVar7);
        test_recv_impl((char *)0x3e,iVar2,0x102117,pcVar7);
        test_send_impl((char *)0x3f,iVar2,0x102117,pcVar7);
        test_recv_impl((char *)0x40,iVar3,0x102117,pcVar7);
        test_close_impl((char *)0x42,iVar2,sock_02);
        test_close_impl((char *)0x43,iVar3,sock_03);
        test_close_impl((char *)0x44,iVar4,sock_04);
        iVar2 = test_socket_impl((char *)0x47,0x30,family_01,(int)pcVar7);
        test_bind_impl((char *)0x48,iVar2,sock_05,pcVar7);
        iVar3 = test_socket_impl((char *)0x49,0x31,family_02,(int)pcVar7);
        test_connect_impl((char *)0x4a,iVar3,sock_06,pcVar7);
        iVar4 = test_socket_impl((char *)0x4b,0x31,family_03,(int)pcVar7);
        test_connect_impl((char *)0x4c,iVar4,sock_07,pcVar7);
        test_send_impl((char *)0x4e,iVar2,0x102117,pcVar7);
        test_recv_impl((char *)0x4f,iVar3,0x102117,pcVar7);
        test_send_impl((char *)0x50,iVar3,0x102117,pcVar7);
        test_recv_impl((char *)0x51,iVar2,0x102117,pcVar7);
        test_send_impl((char *)0x53,iVar2,0x102117,pcVar7);
        test_recv_impl((char *)0x54,iVar4,0x102117,pcVar7);
        test_send_impl((char *)0x55,iVar4,0x102117,pcVar7);
        test_recv_impl((char *)0x56,iVar2,0x102117,pcVar7);
        test_close_impl((char *)0x58,iVar4,sock_08);
        test_close_impl((char *)0x59,iVar3,sock_09);
        test_close_impl((char *)0x5a,iVar2,sock_10);
        iVar2 = test_socket_impl((char *)0x5d,0x31,family_04,(int)pcVar7);
        test_bind_impl((char *)0x5e,iVar2,sock_11,pcVar7);
        iVar3 = test_socket_impl((char *)0x5f,0x30,family_05,(int)pcVar7);
        test_connect_impl((char *)0x60,iVar3,sock_12,pcVar7);
        piVar8 = &resend_ivl;
        resend_ivl = 100;
        iVar4 = nn_setsockopt(iVar3,0x30,1,piVar8,4);
        __stream = _stderr;
        if (iVar4 == 0) {
          test_send_impl((char *)0x66,iVar3,0x102117,(char *)piVar8);
          test_recv_impl((char *)0x67,iVar2,0x102117,(char *)piVar8);
          test_recv_impl((char *)0x69,iVar2,0x102117,(char *)piVar8);
          test_close_impl((char *)0x6b,iVar3,sock_13);
          test_close_impl((char *)0x6c,iVar2,sock_14);
          iVar2 = test_socket_impl((char *)0x71,0x30,family_06,(int)piVar8);
          test_connect_impl((char *)0x72,iVar2,sock_15,(char *)piVar8);
          test_send_impl((char *)0x73,iVar2,0x102117,(char *)piVar8);
          iVar3 = test_socket_impl((char *)0x75,0x31,family_07,(int)piVar8);
          test_bind_impl((char *)0x76,iVar3,sock_16,(char *)piVar8);
          piVar8 = &timeo;
          timeo = 200;
          iVar4 = nn_setsockopt(iVar3,0,5,piVar8,4);
          __stream = _stderr;
          if (iVar4 != 0) {
            puVar6 = (uint *)__errno_location();
            pcVar7 = nn_err_strerror(*puVar6);
            uVar1 = *puVar6;
            uStack_50 = 0x7a;
            goto LAB_00101899;
          }
          test_recv_impl((char *)0x7b,iVar3,0x102117,(char *)piVar8);
          test_close_impl((char *)0x7d,iVar2,sock_17);
          test_close_impl((char *)0x7e,iVar3,sock_18);
          iVar2 = test_socket_impl((char *)0x83,0x30,family_08,(int)piVar8);
          test_bind_impl((char *)0x84,iVar2,sock_19,(char *)piVar8);
          iVar3 = test_socket_impl((char *)0x85,0x31,family_09,(int)piVar8);
          test_connect_impl((char *)0x86,iVar3,sock_20,(char *)piVar8);
          iVar4 = test_socket_impl((char *)0x87,0x31,family_10,(int)piVar8);
          test_connect_impl((char *)0x88,iVar4,sock_21,(char *)piVar8);
          timeo = 200;
          iVar5 = nn_setsockopt(iVar3,0,5,&timeo,4);
          __stream = _stderr;
          if (iVar5 == 0) {
            piVar8 = &timeo;
            iVar5 = nn_setsockopt(iVar4,0,5,piVar8,4);
            __stream = _stderr;
            if (iVar5 == 0) {
              test_send_impl((char *)0x92,iVar2,0x102117,(char *)piVar8);
              test_recv_impl((char *)0x94,iVar3,0x102117,(char *)piVar8);
              test_close_impl((char *)0x96,iVar3,sock_22);
              test_recv_impl((char *)0x98,iVar4,0x102117,(char *)piVar8);
              test_send_impl((char *)0x9a,iVar4,0x102159,(char *)piVar8);
              test_recv_impl((char *)0x9b,iVar2,0x102159,(char *)piVar8);
              test_close_impl((char *)0x9e,iVar2,sock_23);
              test_close_impl((char *)0x9f,iVar4,sock_24);
              iVar2 = test_socket_impl((char *)0xa3,0x30,family_11,(int)piVar8);
              test_connect_impl((char *)0xa4,iVar2,sock_25,(char *)piVar8);
              test_send_impl((char *)0xa5,iVar2,0x102117,(char *)piVar8);
              test_send_impl((char *)0xa6,iVar2,0x10215f,(char *)piVar8);
              iVar3 = test_socket_impl((char *)0xa8,0x31,family_12,(int)piVar8);
              test_bind_impl((char *)0xa9,iVar3,sock_26,(char *)piVar8);
              timeo = 100;
              test_recv_impl((char *)0xae,iVar3,0x10215f,(char *)piVar8);
              test_close_impl((char *)0xb0,iVar2,sock_27);
              test_close_impl((char *)0xb1,iVar3,sock_28);
              return 0;
            }
            puVar6 = (uint *)__errno_location();
            pcVar7 = nn_err_strerror(*puVar6);
            uVar9 = (ulong)*puVar6;
            uStack_50 = 0x90;
          }
          else {
            puVar6 = (uint *)__errno_location();
            pcVar7 = nn_err_strerror(*puVar6);
            uVar9 = (ulong)*puVar6;
            uStack_50 = 0x8d;
          }
        }
        else {
          puVar6 = (uint *)__errno_location();
          pcVar7 = nn_err_strerror(*puVar6);
          uVar1 = *puVar6;
          uStack_50 = 100;
LAB_00101899:
          uVar9 = (ulong)uVar1;
        }
        fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar7,uVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c"
                ,uStack_50);
        goto LAB_0010191b;
      }
    }
    uStack_50 = 0x35;
  }
  else {
LAB_001017ea:
    uStack_50 = 0x33;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == -1 && nn_errno () == EFSM",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/reqrep.c",
          uStack_50);
LAB_0010191b:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int main ()
{
    int rc;
    int rep1;
    int rep2;
    int req1;
    int req2;
    int resend_ivl;
    char buf [7];
    int timeo;

    /*  Test req/rep with full socket types. */
    rep1 = test_socket (AF_SP, NN_REP);
    test_bind (rep1, SOCKET_ADDRESS);
    req1 = test_socket (AF_SP, NN_REQ);
    test_connect (req1, SOCKET_ADDRESS);
    req2 = test_socket (AF_SP, NN_REQ);
    test_connect (req2, SOCKET_ADDRESS);

    /*  Check invalid sequence of sends and recvs. */
    rc = nn_send (rep1, "ABC", 3, 0);
    nn_assert (rc == -1 && nn_errno () == EFSM);
    rc = nn_recv (req1, buf, sizeof (buf), 0);
    nn_assert (rc == -1 && nn_errno () == EFSM);

    /*  Check fair queueing the requests. */
    test_send (req2, "ABC");
    test_recv (rep1, "ABC");
    test_send (rep1, "ABC");
    test_recv (req2, "ABC");

    test_send (req1, "ABC");
    test_recv (rep1, "ABC");
    test_send (rep1, "ABC");
    test_recv (req1, "ABC");

    test_close (rep1);
    test_close (req1);
    test_close (req2);

    /*  Check load-balancing of requests. */
    req1 = test_socket (AF_SP, NN_REQ);
    test_bind (req1, SOCKET_ADDRESS);
    rep1 = test_socket (AF_SP, NN_REP);
    test_connect (rep1, SOCKET_ADDRESS);
    rep2 = test_socket (AF_SP, NN_REP);
    test_connect (rep2, SOCKET_ADDRESS);

    test_send (req1, "ABC");
    test_recv (rep1, "ABC");
    test_send (rep1, "ABC");
    test_recv (req1, "ABC");

    test_send (req1, "ABC");
    test_recv (rep2, "ABC");
    test_send (rep2, "ABC");
    test_recv (req1, "ABC");

    test_close (rep2);
    test_close (rep1);
    test_close (req1);

    /*  Test re-sending of the request. */
    rep1 = test_socket (AF_SP, NN_REP);
    test_bind (rep1, SOCKET_ADDRESS);
    req1 = test_socket (AF_SP, NN_REQ);
    test_connect (req1, SOCKET_ADDRESS);
    resend_ivl = 100;
    rc = nn_setsockopt (req1, NN_REQ, NN_REQ_RESEND_IVL,
        &resend_ivl, sizeof (resend_ivl));
    errno_assert (rc == 0);

    test_send (req1, "ABC");
    test_recv (rep1, "ABC");
    /*  The following waits for request to be resent  */
    test_recv (rep1, "ABC");

    test_close (req1);
    test_close (rep1);

    /*  Check sending a request when the peer is not available. (It should
        be sent immediatelly when the peer comes online rather than relying
        on the resend algorithm. */
    req1 = test_socket (AF_SP, NN_REQ);
    test_connect (req1, SOCKET_ADDRESS);
    test_send (req1, "ABC");

    rep1 = test_socket (AF_SP, NN_REP);
    test_bind (rep1, SOCKET_ADDRESS);
    timeo = 200;
    rc = nn_setsockopt (rep1, NN_SOL_SOCKET, NN_RCVTIMEO,
       &timeo, sizeof (timeo));
    errno_assert (rc == 0);
    test_recv (rep1, "ABC");

    test_close (req1);
    test_close (rep1);

    /*  Check removing socket request sent to (It should
        be sent immediatelly to other peer rather than relying
        on the resend algorithm). */
    req1 = test_socket (AF_SP, NN_REQ);
    test_bind (req1, SOCKET_ADDRESS);
    rep1 = test_socket (AF_SP, NN_REP);
    test_connect (rep1, SOCKET_ADDRESS);
    rep2 = test_socket (AF_SP, NN_REP);
    test_connect (rep2, SOCKET_ADDRESS);

    timeo = 200;
    rc = nn_setsockopt (rep1, NN_SOL_SOCKET, NN_RCVTIMEO,
       &timeo, sizeof (timeo));
    errno_assert (rc == 0);
    rc = nn_setsockopt (rep2, NN_SOL_SOCKET, NN_RCVTIMEO,
       &timeo, sizeof (timeo));
    errno_assert (rc == 0);

    test_send (req1, "ABC");
    /*  We got request through rep1  */
    test_recv (rep1, "ABC");
    /*  But instead replying we simulate crash  */
    test_close (rep1);
    /*  The rep2 should get request immediately  */
    test_recv (rep2, "ABC");
    /*  Let's check it's delivered well  */
    test_send (rep2, "REPLY");
    test_recv (req1, "REPLY");


    test_close (req1);
    test_close (rep2);

    /*  Test cancelling delayed request  */

    req1 = test_socket (AF_SP, NN_REQ);
    test_connect (req1, SOCKET_ADDRESS);
    test_send (req1, "ABC");
    test_send (req1, "DEF");

    rep1 = test_socket (AF_SP, NN_REP);
    test_bind (rep1, SOCKET_ADDRESS);
    timeo = 100;
//    rc = nn_setsockopt (rep1, NN_SOL_SOCKET, NN_RCVTIMEO,
//       &timeo, sizeof (timeo));
//    errno_assert (rc == 0);
    test_recv (rep1, "DEF");

    test_close (req1);
    test_close (rep1);

    return 0;
}